

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall RVO::Agent::insertAgentNeighbor(Agent *this,Agent *agent,float *rangeSq)

{
  bool bVar1;
  float fVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  pair<float,_const_RVO::Agent_*> pVar5;
  pair<float,_const_RVO::Agent_*> local_58;
  size_type local_48;
  size_t i;
  Agent *local_38;
  Vector3 local_30;
  float local_24;
  float *pfStack_20;
  float distSq;
  float *rangeSq_local;
  Agent *agent_local;
  Agent *this_local;
  
  if (this != agent) {
    pfStack_20 = rangeSq;
    rangeSq_local = (float *)agent;
    agent_local = this;
    Vector3::operator-(&local_30,&this->position_);
    local_24 = absSq(&local_30);
    if (local_24 < *pfStack_20) {
      sVar3 = std::
              vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
              ::size(&this->agentNeighbors_);
      if (sVar3 < this->maxNeighbors_) {
        pVar5 = std::make_pair<float_const&,RVO::Agent_const*&>(&local_24,(Agent **)&rangeSq_local);
        local_38 = pVar5.second;
        i._0_4_ = pVar5.first;
        std::
        vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
        ::push_back(&this->agentNeighbors_,(value_type *)&i);
      }
      sVar3 = std::
              vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
              ::size(&this->agentNeighbors_);
      while( true ) {
        fVar2 = local_24;
        local_48 = sVar3 - 1;
        bVar1 = false;
        if (local_48 != 0) {
          pvVar4 = std::
                   vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                   ::operator[](&this->agentNeighbors_,sVar3 - 2);
          bVar1 = fVar2 < pvVar4->first;
        }
        if (!bVar1) break;
        pvVar4 = std::
                 vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ::operator[](&this->agentNeighbors_,local_48 - 1);
        this_00 = std::
                  vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                  ::operator[](&this->agentNeighbors_,local_48);
        std::pair<float,_const_RVO::Agent_*>::operator=(this_00,pvVar4);
        sVar3 = local_48;
      }
      pVar5 = std::make_pair<float_const&,RVO::Agent_const*&>(&local_24,(Agent **)&rangeSq_local);
      local_58.second = pVar5.second;
      local_58.first = pVar5.first;
      pvVar4 = std::
               vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
               ::operator[](&this->agentNeighbors_,local_48);
      std::pair<float,_const_RVO::Agent_*>::operator=(pvVar4,&local_58);
      sVar3 = std::
              vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
              ::size(&this->agentNeighbors_);
      if (sVar3 == this->maxNeighbors_) {
        pvVar4 = std::
                 vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ::back(&this->agentNeighbors_);
        *pfStack_20 = pvVar4->first;
      }
    }
  }
  return;
}

Assistant:

void Agent::insertAgentNeighbor(const Agent *agent, float &rangeSq)
	{
		if (this != agent) {
			const float distSq = absSq(position_ - agent->position_);

			if (distSq < rangeSq) {
				if (agentNeighbors_.size() < maxNeighbors_) {
					agentNeighbors_.push_back(std::make_pair(distSq, agent));
				}

				size_t i = agentNeighbors_.size() - 1;

				while (i != 0 && distSq < agentNeighbors_[i - 1].first) {
					agentNeighbors_[i] = agentNeighbors_[i - 1];
					--i;
				}

				agentNeighbors_[i] = std::make_pair(distSq, agent);

				if (agentNeighbors_.size() == maxNeighbors_) {
					rangeSq = agentNeighbors_.back().first;
				}
			}
		}
	}